

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ObjPrintEqn(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  Vec_Ptr_t *vSuper;
  uint uVar1;
  int Level_00;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  Aig_Obj_t *pRoot;
  
  pRoot = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(undefined8 *)&pRoot->field_0x18 & 7;
  if (uVar1 == 2) {
    pcVar5 = "!";
    if (((ulong)pObj & 1) == 0) {
      pcVar5 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar5,(pRoot->field_5).pData);
    return;
  }
  if (uVar1 == 1) {
    fprintf((FILE *)pFile,"%d",(ulong)((uint)pObj & 1 ^ 1));
    return;
  }
  iVar6 = vLevels->nSize;
  Level_00 = Level + 1;
  if (iVar6 <= Level) {
    if (vLevels->nCap <= Level) {
      if (vLevels->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)Level_00 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(vLevels->pArray,(long)Level_00 << 3);
        iVar6 = vLevels->nSize;
      }
      vLevels->pArray = ppvVar2;
      vLevels->nCap = Level_00;
    }
    if (iVar6 <= Level) {
      lVar4 = (long)iVar6;
      iVar6 = (Level - iVar6) + 1;
      do {
        pvVar3 = calloc(1,0x10);
        vLevels->pArray[lVar4] = pvVar3;
        lVar4 = lVar4 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    vLevels->nSize = Level_00;
    iVar6 = Level_00;
  }
  if ((-1 < Level) && (Level < iVar6)) {
    vSuper = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Aig_ObjCollectMulti(pRoot,vSuper);
    pcVar5 = "(";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    if (0 < vSuper->nSize) {
      pcVar5 = "+";
      if (((ulong)pObj & 1) == 0) {
        pcVar5 = "*";
      }
      lVar4 = 0;
      do {
        Aig_ObjPrintEqn(pFile,(Aig_Obj_t *)((ulong)vSuper->pArray[lVar4] ^ (ulong)((uint)pObj & 1)),
                        vLevels,Level_00);
        iVar6 = vSuper->nSize;
        if (lVar4 < (long)iVar6 + -1) {
          fprintf((FILE *)pFile," %s ",pcVar5);
          iVar6 = vSuper->nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar6);
    }
    pcVar5 = ")";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Aig_ObjPrintEqn( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "!" : "", (char*)pObj->pData );
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintEqn( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "+" : "*" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}